

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

bool __thiscall llvm::DWARFUnitIndex::parse(DWARFUnitIndex *this,DataExtractor IndexData)

{
  bool bVar1;
  bool b;
  DWARFUnitIndex *this_local;
  
  bVar1 = parseImpl(this,IndexData);
  if (!bVar1) {
    (this->Header).NumBuckets = 0;
    std::unique_ptr<llvm::DWARFSectionKind[],_std::default_delete<llvm::DWARFSectionKind[]>_>::reset
              (&this->ColumnKinds,(nullptr_t)0x0);
    std::
    unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>::
    reset(&this->Rows,(nullptr_t)0x0);
  }
  return bVar1;
}

Assistant:

bool DWARFUnitIndex::parse(DataExtractor IndexData) {
  bool b = parseImpl(IndexData);
  if (!b) {
    // Make sure we don't try to dump anything
    Header.NumBuckets = 0;
    // Release any partially initialized data.
    ColumnKinds.reset();
    Rows.reset();
  }
  return b;
}